

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O3

int sf_parser_item(sf_parser *sfp,sf_value *dest)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  int iVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  
  uVar1 = sfp->state;
  if ((int)uVar1 < 0x1b) {
    if (uVar1 == 0) {
      puVar4 = sfp->pos;
      while ((puVar4 != sfp->end && (*puVar4 == ' '))) {
        puVar4 = puVar4 + 1;
        sfp->pos = puVar4;
      }
      if (puVar4 != sfp->end) {
        if (*puVar4 == '(') {
          if (dest != (sf_value *)0x0) {
            dest->type = SF_TYPE_INNER_LIST;
            dest->flags = 0;
          }
          sfp->pos = puVar4 + 1;
          sfp->state = 0x1c;
        }
        else {
          iVar3 = parser_bare_item(sfp,dest);
          if (iVar3 != 0) {
            return iVar3;
          }
          sfp->state = 0x19;
        }
        return 0;
      }
      return -1;
    }
    if (uVar1 != 0x19) {
LAB_00117717:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                    ,0x3e4,"int sf_parser_item(sf_parser *, sf_value *)");
    }
  }
  else {
    if (uVar1 == 0x1b) goto LAB_00117688;
    if (uVar1 != 0x1c) goto LAB_00117717;
    iVar3 = parser_skip_inner_list(sfp);
    if (iVar3 != 0) {
      return -1;
    }
  }
  iVar3 = parser_skip_params(sfp);
  if (iVar3 != 0) {
    return -1;
  }
LAB_00117688:
  puVar4 = sfp->pos;
  puVar2 = sfp->end;
  while ((puVar5 = puVar2, puVar4 != puVar2 && (puVar5 = puVar4, *puVar4 == ' '))) {
    puVar4 = puVar4 + 1;
    sfp->pos = puVar4;
  }
  return ~(uint)(puVar5 == puVar2);
}

Assistant:

int sf_parser_item(sf_parser *sfp, sf_value *dest) {
  int rv;

  switch (sfp->state) {
  case SF_STATE_INITIAL:
    parser_discard_sp(sfp);

    if (parser_eof(sfp)) {
      return SF_ERR_PARSE_ERROR;
    }

    break;
  case SF_STATE_ITEM_INNER_LIST_BEFORE:
    rv = parser_skip_inner_list(sfp);
    if (rv != 0) {
      return rv;
    }

    /* fall through */
  case SF_STATE_ITEM_BEFORE_PARAMS:
    rv = parser_skip_params(sfp);
    if (rv != 0) {
      return rv;
    }

    /* fall through */
  case SF_STATE_ITEM_AFTER:
    parser_discard_sp(sfp);

    if (!parser_eof(sfp)) {
      return SF_ERR_PARSE_ERROR;
    }

    return SF_ERR_EOF;
  default:
    assert(0);
    abort();
  }

  if (*sfp->pos == '(') {
    if (dest) {
      dest->type = SF_TYPE_INNER_LIST;
      dest->flags = SF_VALUE_FLAG_NONE;
    }

    ++sfp->pos;

    sfp->state = SF_STATE_ITEM_INNER_LIST_BEFORE;

    return 0;
  }

  rv = parser_bare_item(sfp, dest);
  if (rv != 0) {
    return rv;
  }

  sfp->state = SF_STATE_ITEM_BEFORE_PARAMS;

  return 0;
}